

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_settings::set_bool(session_settings *this,int name,bool value)

{
  undefined1 local_28 [8];
  unique_lock<std::mutex> l;
  bool value_local;
  int name_local;
  session_settings *this_local;
  
  l._11_1_ = value;
  l._12_4_ = name;
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->m_mutex);
  session_settings_single_thread::set_bool(&this->m_store,l._12_4_,(bool)(l._11_1_ & 1));
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void set_bool(int name, bool value) override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			m_store.set_bool(name, value);
		}